

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# go.h
# Opt level: O2

bool __thiscall
GoState<3U,_4U>::is_alive
          (GoState<3U,_4U> *this,int i_start,int j_start,
          set<std::pair<int,_int>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
          *pieces)

{
  uchar uVar1;
  uchar uVar2;
  iterator iVar3;
  bool bVar4;
  int j;
  int i;
  value_type back;
  vector<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> stack;
  uint local_68;
  uint local_64;
  key_type local_60;
  int local_58;
  int local_54;
  key_type local_50;
  _Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_> local_48;
  
  if (this->board[i_start][j_start] == '\0') {
    bVar4 = true;
  }
  else {
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_58 = j_start;
    local_54 = i_start;
    std::
    _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
    ::clear(&pieces->_M_t);
    std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int&>
              ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_48,&local_54,
               &local_58);
    uVar1 = this->board[local_54][local_58];
    do {
      while( true ) {
        do {
          bVar4 = local_48._M_impl.super__Vector_impl_data._M_start !=
                  local_48._M_impl.super__Vector_impl_data._M_finish;
          if (local_48._M_impl.super__Vector_impl_data._M_start ==
              local_48._M_impl.super__Vector_impl_data._M_finish) goto LAB_00142c6c;
          local_50 = local_48._M_impl.super__Vector_impl_data._M_finish[-1];
          local_48._M_impl.super__Vector_impl_data._M_finish =
               local_48._M_impl.super__Vector_impl_data._M_finish + -1;
          iVar3 = std::
                  _Rb_tree<std::pair<int,_int>,_std::pair<int,_int>,_std::_Identity<std::pair<int,_int>_>,_std::less<std::pair<int,_int>_>,_std::allocator<std::pair<int,_int>_>_>
                  ::find(&pieces->_M_t,&local_50);
        } while ((_Rb_tree_header *)iVar3._M_node != &(pieces->_M_t)._M_impl.super__Rb_tree_header);
        local_64 = local_50.first;
        local_68 = local_50.second;
        uVar2 = this->board[local_50.first][local_50.second];
        if (uVar2 != uVar1) break;
        local_60 = local_50;
        std::
        _Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
        ::_M_insert_unique<std::pair<int,int>>
                  ((_Rb_tree<std::pair<int,int>,std::pair<int,int>,std::_Identity<std::pair<int,int>>,std::less<std::pair<int,int>>,std::allocator<std::pair<int,int>>>
                    *)pieces,&local_60);
        if (0 < (int)local_64) {
          local_60.first = local_64 - 1;
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int&>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_48,
                     &local_60.first,(int *)&local_68);
        }
        if (local_64 < 2) {
          local_60.first = local_64 + 1;
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int,int&>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_48,
                     &local_60.first,(int *)&local_68);
        }
        if (0 < (int)local_68) {
          local_60.first = local_68 - 1;
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_48,
                     (int *)&local_64,&local_60.first);
        }
        if (local_68 < 3) {
          local_60.first = local_68 + 1;
          std::vector<std::pair<int,int>,std::allocator<std::pair<int,int>>>::emplace_back<int&,int>
                    ((vector<std::pair<int,int>,std::allocator<std::pair<int,int>>> *)&local_48,
                     (int *)&local_64,&local_60.first);
        }
      }
    } while (uVar2 != '\0');
LAB_00142c6c:
    std::_Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>::~_Vector_base
              (&local_48);
  }
  return bVar4;
}

Assistant:

virtual bool is_alive(int i_start, int j_start, std::set<std::pair<int, int>>* pieces) const
	{
		if (board[i_start][j_start] == empty) {
			// No piece here, so alive
			return true;
		}

		std::vector<std::pair<int, int>> stack;
		pieces->clear();
		stack.emplace_back(i_start, j_start);
		int player = board[i_start][j_start];

		while (!stack.empty()) {
			auto back = stack.back();
			stack.pop_back();
			if (pieces->find(back) != pieces->end()) {
				// Already checked.
				continue;
			}
			int i,j;
			std::tie(i, j) = back;
			
			if (board[i][j] == player) {

				// Does not work in older GCC.
				//pieces->emplace(i, j);
				pieces->insert(std::make_pair(i, j));

				if (i > 0) {
					stack.emplace_back(i - 1, j);
				}
				if (i < M - 1) {
					stack.emplace_back(i + 1, j);
				}
				if (j > 0) {
					stack.emplace_back(i, j - 1);
				}
				if (j < N - 1) {
					stack.emplace_back(i, j + 1);
				}
			}
			else if (board[i][j] == empty) {
				// Alive.
				return true;
			}
		}
		return false;
	}